

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.h
# Opt level: O1

void __thiscall ser::MetainfoSet::AddMetainfo<double>(MetainfoSet *this,string *key,double *value)

{
  const_iterator cVar1;
  mapped_type *this_00;
  long *plVar2;
  SerializationException *this_01;
  string msg;
  SerializationException exception;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  undefined1 local_30 [24];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ::operator[](&this->data_,key);
    boost::any::operator=(this_00,value);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "Error: metainfo with key = ",key);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  *plVar2 = (long)(plVar2 + 2);
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_40 != (undefined1  [8])local_30) {
    operator_delete((void *)local_40);
  }
  local_40 = (undefined1  [8])&PTR__SerializationException_0018e9e8;
  local_38._M_p = local_30 + 8;
  local_30._0_8_ = 0;
  local_30[8] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_38);
  this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_01,(SerializationException *)local_40);
  __cxa_throw(this_01,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

inline void AddMetainfo(const std::string& key, const ValueType& value)
        {
            // Check that type of meta info is supported
            BOOST_STATIC_ASSERT((   boost::is_same<ValueType, int        >::type::value
                                    || boost::is_same<ValueType, bool       >::type::value
                                    || boost::is_same<ValueType, float      >::type::value
                                    || boost::is_same<ValueType, double     >::type::value
                                    || boost::is_same<ValueType, std::string>::type::value
                                    ));

            // Check that key does not exist yet
            if(HasKey(key))
            {
                std::string msg = "Error: metainfo with key = " + key + " exists already\n";
                SerializationException exception;
                exception.Init(msg);
                throw exception;
            }

            // Set key = value
            data_[key] = value;
        }